

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QSpanCollection::updateSpan(QSpanCollection *this,Span *span,int old_height)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  QMap<int,_QSpanCollection::Span_*> *this_00;
  int in_EDX;
  Span *in_RSI;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_RDI;
  long in_FS_OFFSET;
  int removed;
  iterator it_y_1;
  iterator it_y;
  iterator *in_stack_ffffffffffffff38;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_stack_ffffffffffffff40
  ;
  int *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *in_stack_ffffffffffffff58;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *this_01;
  const_iterator in_stack_ffffffffffffff68;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  iterator local_30;
  iterator local_28;
  int local_20;
  int local_1c;
  iterator local_18;
  Span *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  iVar2 = Span::height(in_RSI);
  if (in_EDX < iVar2) {
    local_18._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    iVar2 = Span::top(local_10);
    local_1c = -(iVar2 + in_EDX + -1);
    local_18._M_node =
         (_Base_ptr)
         QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound
                   (in_stack_ffffffffffffff58,
                    (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    while( true ) {
      piVar5 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::key((iterator *)0x8b038f);
      iVar2 = *piVar5;
      iVar3 = Span::bottom(local_10);
      if (iVar3 < -iVar2) break;
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator*((iterator *)0x8b03c2);
      local_20 = Span::left(local_10);
      local_20 = -local_20;
      QMap<int,_QSpanCollection::Span_*>::insert
                ((QMap<int,_QSpanCollection::Span_*> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,(Span **)in_stack_ffffffffffffff40);
      local_28._M_node =
           (_Base_ptr)
           QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin
                     ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      bVar1 = ::operator==((iterator *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (bVar1) break;
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator--
                ((iterator *)in_stack_ffffffffffffff40);
    }
  }
  else {
    iVar2 = Span::height(local_10);
    if (iVar2 < in_EDX) {
      local_30._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      this_01 = in_RDI + 1;
      local_38 = Span::bottom(local_10);
      local_3c = Span::top(local_10);
      piVar5 = qMax<int>(&local_38,&local_3c);
      local_34 = -*piVar5;
      local_30._M_node =
           (_Base_ptr)
           QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound
                     ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)this_01,
                      (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      while( true ) {
        piVar5 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::key((iterator *)0x8b04fc)
        ;
        iVar2 = -*piVar5;
        iVar3 = Span::top(local_10);
        if (iVar3 + in_EDX + -1 < iVar2) break;
        piVar5 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::key((iterator *)0x8b0536)
        ;
        iVar3 = -*piVar5;
        iVar4 = Span::bottom(local_10);
        if (iVar4 < iVar3) {
          this_00 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator*
                              ((iterator *)0x8b0569);
          local_40 = Span::left(local_10);
          local_40 = -local_40;
          QMap<int,_QSpanCollection::Span_*>::remove(this_00,(char *)&local_40);
          QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator->((iterator *)0x8b05ab)
          ;
          bVar1 = QMap<int,_QSpanCollection::Span_*>::isEmpty
                            ((QMap<int,_QSpanCollection::Span_*> *)in_stack_ffffffffffffff40);
          if (bVar1) {
            in_stack_ffffffffffffff40 = in_RDI + 1;
            QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::const_iterator
                      ((const_iterator *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            local_30._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)this_00,
                            in_stack_ffffffffffffff68._M_node);
          }
        }
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin
                  ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)CONCAT44(iVar2,iVar3));
        bVar1 = ::operator==((iterator *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        if (bVar1) break;
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator--
                  ((iterator *)in_stack_ffffffffffffff40);
      }
    }
  }
  iVar2 = Span::width(local_10);
  if (((iVar2 == 0) && (iVar2 = Span::height(local_10), iVar2 == 0)) &&
     (std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::remove
                (in_RDI,(char *)&local_10), local_10 != (Span *)0x0)) {
    operator_delete(local_10,0x14);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSpanCollection::updateSpan(QSpanCollection::Span *span, int old_height)
{
    if (old_height < span->height()) {
        //add the span as subspan in all the lists that intersect the new covered columns
        Index::iterator it_y = index.lowerBound(-(span->top() + old_height - 1));
        Q_ASSERT(it_y != index.end()); //it_y must exist since the span is in the list
        while (-it_y.key() <= span->bottom()) {
            (*it_y).insert(-span->left(), span);
            if (it_y == index.begin())
                break;
            --it_y;
        }
    } else if (old_height > span->height()) {
        //remove the span from all the subspans lists that intersect the columns not covered anymore
        Index::iterator it_y = index.lowerBound(-qMax(span->bottom(), span->top())); //qMax useful if height is 0
        Q_ASSERT(it_y != index.end()); //it_y must exist since the span is in the list
        while (-it_y.key() <= span->top() + old_height -1) {
            if (-it_y.key() > span->bottom()) {
                int removed = (*it_y).remove(-span->left());
                Q_ASSERT(removed == 1);
                Q_UNUSED(removed);
                if (it_y->isEmpty()) {
                    it_y = index.erase(it_y);
                }
            }
            if (it_y == index.begin())
                break;
            --it_y;
        }
    }

    if (span->width() == 0 && span->height() == 0) {
        spans.remove(span);
        delete span;
    }
}